

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_ManPlaceRandom(Frc_Man_t *p)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int *__ptr;
  long lVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = (long)p->nObjs;
  __ptr = (int *)malloc(lVar7 * 4);
  if (0 < lVar7) {
    lVar4 = 0;
    do {
      __ptr[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar7 != lVar4);
  }
  if (0 < p->nObjs) {
    lVar7 = 0;
    do {
      uVar3 = Gia_ManRandom(0);
      uVar3 = uVar3 % (uint)p->nObjs;
      iVar1 = __ptr[lVar7];
      __ptr[lVar7] = __ptr[(int)uVar3];
      __ptr[(int)uVar3] = iVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nObjs);
  }
  iVar1 = p->nObjData;
  if ((0 < iVar1) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    iVar6 = 0;
    piVar5 = __ptr;
    do {
      piVar2[(long)iVar6 + 4] = *piVar5;
      iVar6 = iVar6 + ((uint)piVar2[iVar6] >> 4) + piVar2[(long)iVar6 + 1] + 6;
      piVar5 = piVar5 + 1;
    } while (iVar6 < iVar1);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Frc_ManPlaceRandom( Frc_Man_t * p )
{
    Frc_Obj_t * pThis;
    int * pPlacement;
    int i, h, Temp, iNext, Counter;
    pPlacement = ABC_ALLOC( int, p->nObjs );
    for ( i = 0; i < p->nObjs; i++ )
        pPlacement[i] = i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        iNext = Gia_ManRandom( 0 ) % p->nObjs;
        Temp = pPlacement[i];
        pPlacement[i] = pPlacement[iNext];
        pPlacement[iNext] = Temp;
    }
    Counter = 0;
    Frc_ManForEachObj( p, pThis, h )
        pThis->pPlace = pPlacement[Counter++];
    ABC_FREE( pPlacement );
}